

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O2

string * GetQtMajorVersion_abi_cxx11_(string *__return_storage_ptr__,cmGeneratorTarget *target)

{
  cmMakefile *this;
  char *pcVar1;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  this = target->Target->Makefile;
  std::__cxx11::string::string((string *)&local_58,"QT_VERSION_MAJOR",(allocator *)&local_38);
  pcVar1 = cmMakefile::GetSafeDefinition(this,&local_58);
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_5a);
  std::__cxx11::string::~string((string *)&local_58);
  if (__return_storage_ptr__->_M_string_length == 0) {
    std::__cxx11::string::string((string *)&local_58,"Qt5Core_VERSION_MAJOR",(allocator *)&local_38)
    ;
    cmMakefile::GetSafeDefinition(this,&local_58);
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::string::string((string *)&local_58,"QT_MAJOR_VERSION",&local_5a);
  std::__cxx11::string::string((string *)&local_38,"",&local_59);
  pcVar1 = cmGeneratorTarget::GetLinkInterfaceDependentStringProperty(target,&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string GetQtMajorVersion(cmGeneratorTarget const* target)
{
  cmMakefile* makefile = target->Target->GetMakefile();
  std::string qtMajorVersion = makefile->GetSafeDefinition("QT_VERSION_MAJOR");
  if (qtMajorVersion.empty()) {
    qtMajorVersion = makefile->GetSafeDefinition("Qt5Core_VERSION_MAJOR");
  }
  const char* targetQtVersion =
    target->GetLinkInterfaceDependentStringProperty("QT_MAJOR_VERSION", "");
  if (targetQtVersion != CM_NULLPTR) {
    qtMajorVersion = targetQtVersion;
  }
  return qtMajorVersion;
}